

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# squall_defun.hpp
# Opt level: O0

int squall::detail::
    Stub<void(std::function<int(std::__cxx11::string_const&)>,std::__cxx11::string_const&)>::
    doit<std::function<void(std::function<int(std::__cxx11::string_const&)>,std::__cxx11::string_const&)>>
              (HSQUIRRELVM vm,SQInteger index,
              function<void_(std::function<int_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
              *f)

{
  int iVar1;
  function<int_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  *in_RCX;
  function<int_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  *x;
  partial_application<std::function<void_(std::function<int_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_&,_std::function<int_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>
  local_c0;
  wrapper_type local_88;
  function<void_(std::function<int_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_68;
  undefined1 local_48 [8];
  partial_application<std::function<void_(std::function<int_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_&,_std::function<int_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>
  newf;
  function<void_(std::function<int_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  *f_local;
  SQInteger index_local;
  HSQUIRRELVM vm_local;
  
  newf.arg._M_invoker = (_Invoker_type)f;
  fetch<std::function<int(std::__cxx11::string_const&)>,(squall::detail::FetchContext)0>
            (&local_88,(detail *)vm,(HSQUIRRELVM)index,(SQInteger)in_RCX);
  unwrap_type<std::function<int(std::__cxx11::string_const&)>>
            ((value_type *)&local_68,(squall *)&local_88,x);
  partial<std::function<void(std::function<int(std::__cxx11::string_const&)>,std::__cxx11::string_const&)>&,std::function<int(std::__cxx11::string_const&)>>
            ((partial_application<std::function<void_(std::function<int_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_&,_std::function<int_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>
              *)local_48,(squall *)f,&local_68,in_RCX);
  std::
  function<int_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function((function<int_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
               *)&local_68);
  std::
  function<int_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_88);
  partial_application<std::function<void_(std::function<int_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_&,_std::function<int_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>
  ::partial_application
            (&local_c0,
             (partial_application<std::function<void_(std::function<int_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_&,_std::function<int_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>
              *)local_48);
  iVar1 = Stub<void(std::__cxx11::string_const&)>::
          doit<squall::detail::partial_application<std::function<void(std::function<int(std::__cxx11::string_const&)>,std::__cxx11::string_const&)>&,std::function<int(std::__cxx11::string_const&)>>>
                    (vm,index + 1,&local_c0);
  partial_application<std::function<void_(std::function<int_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_&,_std::function<int_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>
  ::~partial_application(&local_c0);
  partial_application<std::function<void_(std::function<int_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_&,_std::function<int_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>
  ::~partial_application
            ((partial_application<std::function<void_(std::function<int_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_&,_std::function<int_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>
              *)local_48);
  return iVar1;
}

Assistant:

static int doit(HSQUIRRELVM vm, SQInteger index, F f) {
        auto newf =
            partial(
                f,
                unwrap_type(
                    fetch<H, detail::FetchContext::Argument>(vm, index)));
        return Stub<R (T...)>::doit(vm, index+1, newf);
    }